

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmh.h
# Opt level: O3

size_t __thiscall
frozen::bits::pmh_tables<8ul,frozen::elsa<void>>::
lookup<frozen::basic_string<char>,frozen::elsa<void>>
          (pmh_tables<8ul,frozen::elsa<void>> *this,basic_string<char> *key,elsa<void> *hasher)

{
  size_t sVar1;
  uint uVar2;
  ulong uVar3;
  size_t sVar4;
  
  sVar1 = key->size_;
  uVar3 = (*(ulong *)this ^ 0x811c9dc5) * 0x1000193;
  if (sVar1 == 0) {
    uVar3 = *(ulong *)(this + (ulong)((uint)(uVar3 >> 5) & 0x38) + 8);
    if ((long)uVar3 < 0) {
      uVar2 = ((uint)uVar3 ^ 0x811c9dc5) * 0x1000193;
      goto LAB_0018d882;
    }
  }
  else {
    sVar4 = 0;
    do {
      uVar3 = ((long)key->data_[sVar4] ^ uVar3) * 0x1000193;
      sVar4 = sVar4 + 1;
    } while (sVar1 != sVar4);
    uVar3 = *(ulong *)(this + (ulong)((uint)(uVar3 >> 5) & 0x38) + 8);
    if ((long)uVar3 < 0) {
      uVar3 = (uVar3 ^ 0x811c9dc5) * 0x1000193;
      sVar4 = 0;
      do {
        uVar3 = ((long)key->data_[sVar4] ^ uVar3) * 0x1000193;
        uVar2 = (uint)uVar3;
        sVar4 = sVar4 + 1;
      } while (sVar1 != sVar4);
LAB_0018d882:
      return *(size_t *)(this + (ulong)(uVar2 >> 5 & 0x38) + 0x48);
    }
  }
  return uVar3;
}

Assistant:

constexpr std::size_t lookup(const KeyType & key, const HasherType& hasher) const {
    auto const d = first_table_[hasher(key, static_cast<std::size_t>(first_seed_)) % M];
    if (!d.is_seed()) { return static_cast<std::size_t>(d.value()); } // this is narrowing std::uint64 -> std::size_t but should be fine
    else { return second_table_[hasher(key, static_cast<std::size_t>(d.value())) % M]; }
  }